

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O1

void __thiscall
hbm::streaming::SubscribedSignal::setDataFormat(SubscribedSignal *this,Value *params)

{
  bool bVar1;
  int iVar2;
  dataType_t dVar3;
  UInt UVar4;
  Value *pVVar5;
  runtime_error *prVar6;
  pattern_t pVar7;
  size_t sVar8;
  string dataValueType;
  string endianness;
  string dataFormatPattern;
  string dataTimeType;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pVVar5 = Json::Value::operator[](params,"pattern");
  Json::Value::asString_abi_cxx11_(&local_58,pVVar5);
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar2 == 0) {
    pVar7 = PATTERN_V;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar2 == 0) {
      pVar7 = PATTERN_TV;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_58);
      pVar7 = PATTERN_TB;
      if (iVar2 != 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"invalid data pattern");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  this->m_dataFormatPattern = pVar7;
  pVVar5 = Json::Value::operator[](params,"endian");
  Json::Value::asString_abi_cxx11_(&local_78,pVVar5);
  iVar2 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar2 != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"invalid endianness");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = false;
  }
  this->m_dataIsBigEndian = bVar1;
  pVVar5 = Json::Value::operator[](params,"valueType");
  Json::Value::asString_abi_cxx11_(&local_98,pVVar5);
  iVar2 = std::__cxx11::string::compare((char *)&local_98);
  sVar8 = 4;
  if (iVar2 == 0) {
    dVar3 = DATATYPE_REAL32;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar2 == 0) {
      dVar3 = DATATYPE_U32;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar2 == 0) {
        dVar3 = DATATYPE_S32;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_98);
        sVar8 = 8;
        if (iVar2 == 0) {
          dVar3 = DATATYPE_REAL64;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_98);
          if (iVar2 == 0) {
            dVar3 = DATATYPE_U64;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_98);
            if (iVar2 == 0) {
              dVar3 = DATATYPE_S64;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_98);
              if (iVar2 != 0) {
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar6,"invalid value type");
                __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              sVar8 = 1;
              dVar3 = DATATYPE_CANRAW;
            }
          }
        }
      }
    }
  }
  this->m_dataValueType = dVar3;
  this->m_dataValueSize = sVar8;
  pVVar5 = Json::Value::operator[](params,"time");
  pVVar5 = Json::Value::operator[](pVVar5,"type");
  Json::Value::asString_abi_cxx11_(&local_38,pVVar5);
  iVar2 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar2 == 0) {
    this->m_dataTimeType = TIMETYPE_NTP;
  }
  pVVar5 = Json::Value::operator[](params,"time");
  pVVar5 = Json::Value::operator[](pVVar5,"size");
  UVar4 = Json::Value::asUInt(pVVar5);
  this->m_dataTimeSize = (ulong)UVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SubscribedSignal::setDataFormat(const Json::Value& params)
		{
			std::string dataFormatPattern = params["pattern"].asString();
			if(dataFormatPattern=="V") {
				m_dataFormatPattern = PATTERN_V;
			} else if(dataFormatPattern=="TV"){
				m_dataFormatPattern = PATTERN_TV;
			} else if(dataFormatPattern=="TB"){
				m_dataFormatPattern = PATTERN_TB;
			} else {
				throw std::runtime_error("invalid data pattern");
			}

			std::string endianness = params["endian"].asString();
			if(endianness=="big") {
				m_dataIsBigEndian = true;
			} else if(endianness=="little") {
				m_dataIsBigEndian = false;
			} else {
				throw std::runtime_error("invalid endianness");
			}
			std::string dataValueType = params["valueType"].asString();
			if(dataValueType=="real32") {
				m_dataValueType = DATATYPE_REAL32;
				m_dataValueSize = 4;
			} else if(dataValueType=="u32") {
				m_dataValueType = DATATYPE_U32;
				m_dataValueSize = 4;
			} else if(dataValueType=="s32") {
				m_dataValueType = DATATYPE_S32;
				m_dataValueSize = 4;
			} else if(dataValueType=="real64") {
				m_dataValueType = DATATYPE_REAL64;
				m_dataValueSize = 8;
			} else if(dataValueType=="u64") {
				m_dataValueType = DATATYPE_U64;
				m_dataValueSize = 8;
			} else if(dataValueType=="s64") {
				m_dataValueType = DATATYPE_S64;
				m_dataValueSize = 8;
            } else if(dataValueType == "CanRaw") {
                m_dataValueType = DATATYPE_CANRAW;
                m_dataValueSize = 1;
			} else {
				throw std::runtime_error("invalid value type");
			}


			std::string dataTimeType = params["time"]["type"].asString();
			if(dataTimeType=="ntp") {
				m_dataTimeType = TIMETYPE_NTP;
			}

			m_dataTimeSize = params["time"]["size"].asUInt();

		}